

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint64_t uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar7;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  void *pvVar8;
  undefined1 *puVar9;
  byte bVar10;
  bool bVar11;
  undefined4 in_register_0000000c;
  secp256k1_fe *psVar12;
  undefined1 *puVar13;
  secp256k1_gej *psVar14;
  uint uVar15;
  ulong extraout_RDX;
  secp256k1_ge *a_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *extraout_RDX_03;
  long lVar19;
  long lVar20;
  code *extraout_RDX_04;
  uint uVar21;
  secp256k1_gej *unaff_RBX;
  secp256k1_fe *unaff_RBP;
  secp256k1_fe *psVar22;
  secp256k1_modinv64_modinfo *psVar23;
  undefined4 in_register_00000034;
  secp256k1_gej *psVar24;
  ulong uVar25;
  ulong uVar26;
  secp256k1_gej *ng;
  secp256k1_gej *r;
  uint64_t *puVar27;
  long lVar28;
  secp256k1_gej *psVar29;
  secp256k1_gej *psVar30;
  uint uVar31;
  ulong unaff_R12;
  secp256k1_gej *psVar32;
  secp256k1_fe *unaff_R13;
  secp256k1_fe *psVar33;
  secp256k1_gej *psVar34;
  secp256k1_scalar *unaff_R14;
  secp256k1_gej *psVar35;
  secp256k1_gej *psVar36;
  uint uVar37;
  secp256k1_fe *unaff_R15;
  secp256k1_gej *psVar38;
  secp256k1_gej *psVar39;
  secp256k1_gej *psVar40;
  secp256k1_scalar sStack_d4c;
  secp256k1_strauss_state sStack_d48;
  secp256k1_gej sStack_d30;
  secp256k1_gej sStack_c98;
  secp256k1_fe asStack_c00 [4];
  secp256k1_ge sStack_b38;
  secp256k1_ge asStack_ad0 [4];
  secp256k1_strauss_point_state sStack_930;
  secp256k1_gej *psStack_518;
  secp256k1_gej *psStack_510;
  secp256k1_gej *psStack_508;
  secp256k1_gej *psStack_500;
  secp256k1_gej *psStack_4f8;
  secp256k1_gej *psStack_4f0;
  int iStack_4e4;
  secp256k1_gej *psStack_4e0;
  uint64_t uStack_4d8;
  uint64_t uStack_4d0;
  uint64_t uStack_4c8;
  secp256k1_gej *psStack_4c0;
  secp256k1_gej *psStack_4b8;
  secp256k1_gej *psStack_4b0;
  secp256k1_gej *psStack_4a8;
  secp256k1_gej *psStack_4a0;
  secp256k1_gej *psStack_498;
  uint uStack_484;
  secp256k1_gej *psStack_480;
  secp256k1_gej *psStack_478;
  long lStack_470;
  ulong uStack_468;
  ulong uStack_460;
  secp256k1_gej *psStack_458;
  undefined1 auStack_450 [56];
  uint64_t uStack_418;
  uint64_t uStack_410;
  uint64_t uStack_408;
  ulong auStack_400 [2];
  undefined1 auStack_3f0 [56];
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  undefined1 auStack_3a0 [48];
  uint64_t uStack_370;
  uint64_t uStack_368;
  uint64_t uStack_360;
  uint64_t uStack_358;
  undefined1 auStack_350 [96];
  secp256k1_gej *psStack_2f0;
  ulong uStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_gej *psStack_2b0;
  secp256k1_fe *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  undefined1 auStack_298 [56];
  uint64_t uStack_260;
  uint64_t uStack_258;
  uint64_t uStack_250;
  uint64_t uStack_248;
  int iStack_240;
  undefined1 auStack_238 [56];
  secp256k1_gej *psStack_200;
  secp256k1_gej *psStack_1f8;
  secp256k1_gej *psStack_1f0;
  secp256k1_gej *psStack_1e8;
  ulong uStack_1e0;
  undefined1 auStack_1d8 [56];
  secp256k1_gej *psStack_1a0;
  secp256k1_gej *psStack_198;
  secp256k1_gej *psStack_190;
  ulong uStack_188;
  ulong uStack_180;
  secp256k1_fe sStack_178;
  secp256k1_fe sStack_148;
  secp256k1_fe sStack_118;
  secp256k1_fe sStack_e8;
  uint64_t uStack_b8;
  uint64_t uStack_b0;
  uint64_t uStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  ulong uStack_90;
  secp256k1_gej *psStack_80;
  ulong uStack_78;
  secp256k1_fe *psStack_70;
  secp256k1_scalar *psStack_68;
  secp256k1_fe *psStack_60;
  secp256k1_fe *psStack_58;
  secp256k1_gej *psStack_48;
  code *pcStack_40;
  secp256k1_fe *local_38;
  
  psVar36 = (secp256k1_gej *)CONCAT44(in_register_00000034,len);
  psVar12 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  psVar35 = psVar36;
  local_38 = (secp256k1_fe *)wnaf;
  if (wnaf == (int *)0x0) goto LAB_0011d77d;
  unaff_RBX = psVar36;
  psVar22 = unaff_RBP;
  psVar33 = unaff_R13;
  if (psVar36 == (secp256k1_gej *)0x0) goto LAB_0011d782;
  psVar35 = (secp256k1_gej *)0x0;
  pcStack_40 = (code *)0x11d67c;
  memset(wnaf,0,0x204);
  uVar15 = (uint)(psVar36->x).n[0];
  unaff_R14 = (secp256k1_scalar *)(ulong)uVar15;
  pcStack_40 = (code *)0x11d687;
  secp256k1_scalar_verify(unaff_R14);
  unaff_R12 = 0;
  unaff_RBP = (secp256k1_fe *)0xffffffff;
  psVar33 = (secp256k1_fe *)0x0;
  do {
    psVar22 = psVar33;
    wnaf = (int *)(ulong)uVar15;
    pcStack_40 = (code *)0x11d69a;
    secp256k1_scalar_verify((secp256k1_scalar *)wnaf);
    uVar37 = (uint)psVar22;
    uVar21 = uVar15 >> ((byte)psVar22 & 0x1f);
    unaff_RBX = (secp256k1_gej *)(ulong)uVar21;
    psVar12 = psVar22;
    if ((uVar37 < 0x20 & uVar21) == (uint)unaff_R12) {
      uVar37 = uVar37 + 1;
      psVar22 = unaff_RBP;
    }
    else {
      uVar4 = 0x81 - uVar37;
      if ((int)uVar37 < 0x7e) {
        uVar4 = 4;
      }
      unaff_R13 = (secp256k1_fe *)(ulong)uVar4;
      pcStack_40 = (code *)0x11d6d8;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar15);
      wnaf = (int *)(ulong)uVar15;
      pcStack_40 = (code *)0x11d6e0;
      secp256k1_scalar_verify((secp256k1_scalar *)wnaf);
      if (uVar4 - 0x21 < 0xffffffe0) {
        pcStack_40 = (code *)0x11d778;
        secp256k1_ecmult_wnaf_cold_1();
        unaff_R15 = psVar22;
        goto LAB_0011d778;
      }
      uVar21 = uVar21 & 0xf;
      if (0x1f < uVar37) {
        uVar21 = 0;
      }
      uVar21 = uVar21 + (uint)unaff_R12;
      uVar31 = uVar21 >> 3 & 1;
      unaff_R12 = (ulong)uVar31;
      uVar21 = uVar21 + uVar31 * -0x10;
      unaff_RBX = (secp256k1_gej *)(ulong)uVar21;
      *(uint *)((long)local_38->n + (long)(int)uVar37 * 4) = uVar21;
      uVar37 = uVar4 + uVar37;
      psVar12 = local_38;
    }
    psVar33 = (secp256k1_fe *)(ulong)uVar37;
    unaff_RBP = psVar22;
  } while ((int)uVar37 < 0x81);
  unaff_R15 = psVar33;
  if ((int)unaff_R12 == 0) {
    unaff_R13 = psVar33;
    if (uVar37 < 0x100) {
      do {
        wnaf = (int *)(ulong)uVar15;
        pcStack_40 = (code *)0x11d748;
        secp256k1_scalar_verify((secp256k1_scalar *)wnaf);
        uVar37 = (uint)unaff_R13;
        if ((uVar37 < 0x20) && ((uVar15 >> (uVar37 & 0x1f) & 1) != 0)) goto LAB_0011d778;
        unaff_R13 = (secp256k1_fe *)(ulong)(uVar37 + 1);
      } while (uVar37 + 1 != 0x100);
    }
    return (int)psVar22 + 1;
  }
  goto LAB_0011d787;
LAB_0011d778:
  pcStack_40 = (code *)0x11d77d;
  secp256k1_ecmult_wnaf_cold_3();
LAB_0011d77d:
  pcStack_40 = (code *)0x11d782;
  secp256k1_ecmult_wnaf_cold_5();
  psVar22 = unaff_RBP;
  psVar33 = unaff_R13;
LAB_0011d782:
  pcStack_40 = (code *)0x11d787;
  secp256k1_ecmult_wnaf_cold_4();
LAB_0011d787:
  pcStack_40 = secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_2();
  psStack_48 = unaff_RBX;
  pcStack_40 = (code *)unaff_R14;
  if ((extraout_RDX & 1) == 0) {
    psStack_58 = (secp256k1_fe *)0x11d852;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011d852:
    psStack_58 = (secp256k1_fe *)0x11d857;
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    uVar15 = (uint)extraout_RDX;
    if ((int)uVar15 < -7) goto LAB_0011d852;
    if ((int)uVar15 < 8) {
      if ((int)uVar15 < 1) {
        psStack_58 = (secp256k1_fe *)0x11d7df;
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)wnaf,
                   (secp256k1_ge_storage *)((long)&psVar35->x + (ulong)(~uVar15 >> 1) * 0x40));
        psStack_58 = (secp256k1_fe *)0x11d7eb;
        secp256k1_fe_verify(&((secp256k1_gej *)wnaf)->y);
        psStack_58 = (secp256k1_fe *)0x11d7f8;
        secp256k1_fe_verify_magnitude
                  ((secp256k1_fe *)(ulong)(uint)(((secp256k1_gej *)wnaf)->y).magnitude,1);
        uVar1 = (((secp256k1_gej *)wnaf)->y).n[1];
        uVar5 = (((secp256k1_gej *)wnaf)->y).n[2];
        uVar6 = (((secp256k1_gej *)wnaf)->y).n[3];
        (((secp256k1_gej *)wnaf)->y).n[0] = 0x3ffffbfffff0bc - (((secp256k1_gej *)wnaf)->y).n[0];
        (((secp256k1_gej *)wnaf)->y).n[1] = 0x3ffffffffffffc - uVar1;
        (((secp256k1_gej *)wnaf)->y).n[2] = 0x3ffffffffffffc - uVar5;
        (((secp256k1_gej *)wnaf)->y).n[3] = 0x3ffffffffffffc - uVar6;
        (((secp256k1_gej *)wnaf)->y).n[4] = 0x3fffffffffffc - (((secp256k1_gej *)wnaf)->y).n[4];
        (((secp256k1_gej *)wnaf)->y).magnitude = 2;
        (((secp256k1_gej *)wnaf)->y).normalized = 0;
        secp256k1_fe_verify(&((secp256k1_gej *)wnaf)->y);
        return extraout_EAX_00;
      }
      secp256k1_ge_from_storage
                ((secp256k1_ge *)wnaf,
                 (secp256k1_ge_storage *)((long)&psVar35->x + (ulong)(uVar15 - 1 >> 1) * 0x40));
      return extraout_EAX;
    }
  }
  psStack_58 = (secp256k1_fe *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_2f0 = (secp256k1_gej *)0x11d881;
  psStack_80 = unaff_RBX;
  uStack_78 = unaff_R12;
  psStack_70 = psVar33;
  psStack_68 = unaff_R14;
  psStack_60 = unaff_R15;
  psStack_58 = psVar22;
  secp256k1_gej_verify(psVar35);
  psStack_2f0 = (secp256k1_gej *)0x11d889;
  secp256k1_ge_verify(a_00);
  psStack_2f0 = (secp256k1_gej *)0x11d891;
  secp256k1_fe_verify(psVar12);
  if (psVar35->infinity != 0) {
    ((secp256k1_gej *)wnaf)->infinity = a_00->infinity;
    psStack_2f0 = (secp256k1_gej *)0x11d8bd;
    secp256k1_fe_sqr(&sStack_178,psVar12);
    psStack_2f0 = (secp256k1_gej *)0x11d8d3;
    secp256k1_fe_mul(&sStack_e8,&sStack_178,psVar12);
    psStack_2f0 = (secp256k1_gej *)0x11d8e1;
    secp256k1_fe_mul((secp256k1_fe *)wnaf,&a_00->x,&sStack_178);
    psStack_2f0 = (secp256k1_gej *)0x11d8f4;
    secp256k1_fe_mul(&((secp256k1_gej *)wnaf)->y,&a_00->y,&sStack_e8);
    psVar35 = (secp256k1_gej *)&((secp256k1_gej *)wnaf)->z;
    (((secp256k1_gej *)wnaf)->z).n[0] = 1;
    (((secp256k1_gej *)wnaf)->z).n[1] = 0;
    (((secp256k1_gej *)wnaf)->z).n[2] = 0;
    (((secp256k1_gej *)wnaf)->z).n[3] = 0;
    (((secp256k1_gej *)wnaf)->z).n[4] = 0;
    (((secp256k1_gej *)wnaf)->z).magnitude = 1;
    (((secp256k1_gej *)wnaf)->z).normalized = 1;
LAB_0011d91f:
    psStack_2f0 = (secp256k1_gej *)0x11d924;
    secp256k1_fe_verify(&psVar35->x);
    psStack_2f0 = (secp256k1_gej *)0x11d92c;
    secp256k1_gej_verify((secp256k1_gej *)wnaf);
    return extraout_EAX_01;
  }
  if (a_00->infinity != 0) {
    pvVar8 = memcpy(wnaf,psVar35,0x98);
    return (int)pvVar8;
  }
  psStack_2a8 = &psVar35->z;
  psStack_2f0 = (secp256k1_gej *)0x11d983;
  secp256k1_fe_mul(&sStack_178,psStack_2a8,psVar12);
  psStack_2f0 = (secp256k1_gej *)0x11d996;
  secp256k1_fe_sqr(&sStack_e8,&sStack_178);
  sStack_148.n[0] = (psVar35->x).n[0];
  sStack_148.n[1] = (psVar35->x).n[1];
  sStack_148.n[2] = (psVar35->x).n[2];
  sStack_148.n[3] = (psVar35->x).n[3];
  sStack_148.n[4] = (psVar35->x).n[4];
  sStack_148.magnitude = (psVar35->x).magnitude;
  sStack_148.normalized = (psVar35->x).normalized;
  psStack_2f0 = (secp256k1_gej *)0x11d9cb;
  secp256k1_fe_mul((secp256k1_fe *)auStack_238,&a_00->x,&sStack_e8);
  auStack_298._0_8_ = (psVar35->y).n[0];
  auStack_298._8_8_ = (psVar35->y).n[1];
  auStack_298._16_8_ = (psVar35->y).n[2];
  auStack_298._24_8_ = (psVar35->y).n[3];
  auStack_298._32_8_ = (psVar35->y).n[4];
  auStack_298._40_4_ = (psVar35->y).magnitude;
  auStack_298._44_4_ = (psVar35->y).normalized;
  psStack_2f0 = (secp256k1_gej *)0x11da0c;
  psStack_2e0 = psVar35;
  secp256k1_fe_mul(&sStack_118,&a_00->y,&sStack_e8);
  psStack_2f0 = (secp256k1_gej *)0x11da1f;
  secp256k1_fe_mul(&sStack_118,&sStack_118,&sStack_178);
  psStack_2f0 = (secp256k1_gej *)0x11da27;
  secp256k1_fe_verify(&sStack_148);
  psVar24 = (secp256k1_gej *)0x4;
  psStack_2f0 = (secp256k1_gej *)0x11da34;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_148._40_8_ & 0xffffffff),4);
  psVar35 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_148.n[0]);
  psVar34 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_148.n[1]);
  psVar23 = (secp256k1_modinv64_modinfo *)(0x9ffffffffffff6 - sStack_148.n[2]);
  psVar32 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_148.n[3]);
  uStack_2e8 = 0x9fffffffffff6 - sStack_148.n[4];
  uStack_180 = 5;
  psStack_2f0 = (secp256k1_gej *)0x11daa1;
  auStack_1d8._48_8_ = psVar35;
  psStack_1a0 = psVar34;
  psStack_198 = (secp256k1_gej *)psVar23;
  psStack_190 = psVar32;
  uStack_188 = uStack_2e8;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1d8 + 0x30));
  psStack_2f0 = (secp256k1_gej *)0x11daa9;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1d8 + 0x30));
  psVar38 = (secp256k1_gej *)auStack_238;
  psStack_2f0 = (secp256k1_gej *)0x11dab9;
  psVar36 = psVar38;
  secp256k1_fe_verify((secp256k1_fe *)psVar38);
  if ((int)auStack_238._40_4_ < 0x1c) {
    psStack_2a0 = (secp256k1_gej *)((long)(psVar35->x).n + auStack_238._0_8_);
    psStack_2b0 = (secp256k1_gej *)((long)(psVar34->x).n + auStack_238._8_8_);
    psStack_2c0 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + auStack_238._16_8_);
    psStack_2b8 = (secp256k1_gej *)((long)(psVar32->x).n + auStack_238._24_8_);
    uStack_2e8 = uStack_2e8 + auStack_238._32_8_;
    uStack_180 = (ulong)(auStack_238._40_4_ + 5);
    psStack_2f0 = (secp256k1_gej *)0x11db37;
    auStack_1d8._48_8_ = psStack_2a0;
    psStack_1a0 = psStack_2b0;
    psStack_198 = psStack_2c0;
    psStack_190 = psStack_2b8;
    uStack_188 = uStack_2e8;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1d8 + 0x30));
    psStack_2f0 = (secp256k1_gej *)0x11db47;
    secp256k1_fe_verify(&sStack_118);
    psVar24 = (secp256k1_gej *)0x1;
    psStack_2f0 = (secp256k1_gej *)0x11db55;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_118.magnitude,1);
    psVar32 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_118.n[0]);
    psVar23 = (secp256k1_modinv64_modinfo *)(0x3ffffffffffffc - sStack_118.n[1]);
    psVar34 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_118.n[2]);
    psVar38 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_118.n[3]);
    psVar35 = (secp256k1_gej *)(0x3fffffffffffc - sStack_118.n[4]);
    uStack_1e0 = 2;
    psStack_2f0 = (secp256k1_gej *)0x11dbb7;
    auStack_238._48_8_ = psVar32;
    psStack_200 = (secp256k1_gej *)psVar23;
    psStack_1f8 = psVar34;
    psStack_1f0 = psVar38;
    psStack_1e8 = psVar35;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_238 + 0x30));
    psStack_2f0 = (secp256k1_gej *)0x11dbc4;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_238 + 0x30));
    psVar36 = (secp256k1_gej *)auStack_298;
    psStack_2f0 = (secp256k1_gej *)0x11dbce;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    if (0x1e < (int)auStack_298._40_4_) goto LAB_0011e0cd;
    psStack_2d0 = (secp256k1_gej *)((long)(psVar32->x).n + auStack_298._0_8_);
    psStack_2c8 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + auStack_298._8_8_);
    psStack_2d8 = (secp256k1_gej *)((long)(psVar34->x).n + auStack_298._16_8_);
    psVar34 = (secp256k1_gej *)((long)(psVar38->x).n + auStack_298._24_8_);
    psVar23 = (secp256k1_modinv64_modinfo *)((long)(psVar35->x).n + auStack_298._32_8_);
    uStack_1e0 = (ulong)(auStack_298._40_4_ + 2);
    psStack_2f0 = (secp256k1_gej *)0x11dc37;
    auStack_238._48_8_ = psStack_2d0;
    psStack_200 = psStack_2c8;
    psStack_1f8 = psStack_2d8;
    psStack_1f0 = psVar34;
    psStack_1e8 = (secp256k1_gej *)psVar23;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_238 + 0x30));
    psStack_2f0 = (secp256k1_gej *)0x11dc44;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1d8 + 0x30));
    puVar9 = (undefined1 *)((uStack_2e8 >> 0x30) * 0x1000003d1 + (long)psStack_2a0);
    if ((((ulong)puVar9 & 0xfffffffffffff) == 0xffffefffffc2f) ||
       (((ulong)puVar9 & 0xfffffffffffff) == 0)) {
      uVar16 = (long)(psStack_2b0->x).n + ((ulong)puVar9 >> 0x34);
      puVar13 = (undefined1 *)((long)(psStack_2c0->x).n + (uVar16 >> 0x34));
      uVar18 = (long)(psStack_2b8->x).n + ((ulong)puVar13 >> 0x34);
      uVar25 = (uVar18 >> 0x34) + (uStack_2e8 & 0xffffffffffff);
      if ((((uVar16 | (ulong)puVar9 | (ulong)puVar13 | uVar18) & 0xfffffffffffff) == 0 &&
           uVar25 == 0) ||
         ((((ulong)puVar9 | 0x1000003d0) & uVar16 & (ulong)puVar13 & uVar18 &
          (uVar25 ^ 0xf000000000000)) == 0xfffffffffffff)) {
        psStack_2f0 = (secp256k1_gej *)0x11e009;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_238 + 0x30));
        uVar18 = ((ulong)psVar23 >> 0x30) * 0x1000003d1 + (long)psStack_2d0;
        if (((uVar18 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar18 & 0xfffffffffffff) == 0)) {
          puVar9 = (undefined1 *)((long)(psStack_2c8->x).n + (uVar18 >> 0x34));
          uVar25 = (long)(psStack_2d8->x).n + ((ulong)puVar9 >> 0x34);
          uVar16 = (long)(psVar34->x).n + (uVar25 >> 0x34);
          uVar17 = (uVar16 >> 0x34) + ((ulong)psVar23 & 0xffffffffffff);
          if (((((ulong)puVar9 | uVar18 | uVar25 | uVar16) & 0xfffffffffffff) == 0 && uVar17 == 0)
             || (((uVar18 | 0x1000003d0) & (ulong)puVar9 & uVar25 & uVar16 &
                 (uVar17 ^ 0xf000000000000)) == 0xfffffffffffff)) {
            psStack_2f0 = (secp256k1_gej *)0x11e0c3;
            secp256k1_gej_double_var((secp256k1_gej *)wnaf,psStack_2e0,(secp256k1_fe *)0x0);
            return extraout_EAX_03;
          }
        }
        psStack_2f0 = (secp256k1_gej *)0x11e0af;
        secp256k1_gej_set_infinity((secp256k1_gej *)wnaf);
        return extraout_EAX_02;
      }
    }
    ((secp256k1_gej *)wnaf)->infinity = 0;
    psVar38 = (secp256k1_gej *)(auStack_1d8 + 0x30);
    psStack_2f0 = (secp256k1_gej *)0x11dd2b;
    secp256k1_fe_mul(&((secp256k1_gej *)wnaf)->z,psStack_2a8,(secp256k1_fe *)psVar38);
    psVar35 = (secp256k1_gej *)&uStack_b8;
    psStack_2f0 = (secp256k1_gej *)0x11dd3e;
    secp256k1_fe_sqr((secp256k1_fe *)psVar35,(secp256k1_fe *)psVar38);
    psStack_2f0 = (secp256k1_gej *)0x11dd46;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    psStack_2f0 = (secp256k1_gej *)0x11dd54;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(uStack_90 & 0xffffffff),1);
    uStack_b8 = 0x3ffffbfffff0bc - uStack_b8;
    uStack_b0 = 0x3ffffffffffffc - uStack_b0;
    uStack_a8 = 0x3ffffffffffffc - uStack_a8;
    uStack_a0 = 0x3ffffffffffffc - uStack_a0;
    uStack_98 = 0x3fffffffffffc - uStack_98;
    uStack_90 = 2;
    psStack_2f0 = (secp256k1_gej *)0x11dd9c;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    psVar32 = (secp256k1_gej *)(auStack_298 + 0x30);
    psStack_2f0 = (secp256k1_gej *)0x11ddb2;
    secp256k1_fe_mul((secp256k1_fe *)psVar32,(secp256k1_fe *)psVar35,(secp256k1_fe *)psVar38);
    psStack_2f0 = (secp256k1_gej *)0x11ddca;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1d8,&sStack_148,(secp256k1_fe *)psVar35);
    psVar24 = (secp256k1_gej *)(auStack_238 + 0x30);
    psStack_2f0 = (secp256k1_gej *)0x11ddda;
    secp256k1_fe_sqr((secp256k1_fe *)wnaf,(secp256k1_fe *)psVar24);
    psStack_2f0 = (secp256k1_gej *)0x11dde2;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psStack_2f0 = (secp256k1_gej *)0x11ddea;
    psVar36 = psVar32;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    iVar7 = iStack_240 + (((secp256k1_gej *)wnaf)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0011e0d2;
    uVar1 = (((secp256k1_gej *)wnaf)->x).n[1];
    uVar5 = (((secp256k1_gej *)wnaf)->x).n[2];
    uVar6 = (((secp256k1_gej *)wnaf)->x).n[3];
    (((secp256k1_gej *)wnaf)->x).n[0] = (((secp256k1_gej *)wnaf)->x).n[0] + auStack_298._48_8_;
    (((secp256k1_gej *)wnaf)->x).n[1] = uVar1 + uStack_260;
    (((secp256k1_gej *)wnaf)->x).n[2] = uVar5 + uStack_258;
    (((secp256k1_gej *)wnaf)->x).n[3] = uVar6 + uStack_250;
    puVar27 = (((secp256k1_gej *)wnaf)->x).n + 4;
    *puVar27 = *puVar27 + uStack_248;
    (((secp256k1_gej *)wnaf)->x).magnitude = iVar7;
    (((secp256k1_gej *)wnaf)->x).normalized = 0;
    psStack_2f0 = (secp256k1_gej *)0x11de3d;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psStack_2f0 = (secp256k1_gej *)0x11de45;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psVar35 = (secp256k1_gej *)auStack_1d8;
    psStack_2f0 = (secp256k1_gej *)0x11de55;
    psVar36 = psVar35;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    iVar7 = auStack_1d8._40_4_ + (((secp256k1_gej *)wnaf)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0011e0d7;
    uVar1 = (((secp256k1_gej *)wnaf)->x).n[1];
    uVar5 = (((secp256k1_gej *)wnaf)->x).n[2];
    uVar6 = (((secp256k1_gej *)wnaf)->x).n[3];
    psVar35 = (secp256k1_gej *)auStack_1d8;
    (((secp256k1_gej *)wnaf)->x).n[0] = (((secp256k1_gej *)wnaf)->x).n[0] + auStack_1d8._0_8_;
    (((secp256k1_gej *)wnaf)->x).n[1] = uVar1 + auStack_1d8._8_8_;
    (((secp256k1_gej *)wnaf)->x).n[2] = uVar5 + auStack_1d8._16_8_;
    (((secp256k1_gej *)wnaf)->x).n[3] = uVar6 + auStack_1d8._24_8_;
    puVar27 = (((secp256k1_gej *)wnaf)->x).n + 4;
    *puVar27 = *puVar27 + auStack_1d8._32_8_;
    (((secp256k1_gej *)wnaf)->x).magnitude = iVar7;
    (((secp256k1_gej *)wnaf)->x).normalized = 0;
    psStack_2f0 = (secp256k1_gej *)0x11dea4;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psStack_2f0 = (secp256k1_gej *)0x11deac;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psStack_2f0 = (secp256k1_gej *)0x11deb4;
    psVar36 = psVar35;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    iVar7 = auStack_1d8._40_4_ + (((secp256k1_gej *)wnaf)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0011e0dc;
    uVar1 = (((secp256k1_gej *)wnaf)->x).n[1];
    uVar5 = (((secp256k1_gej *)wnaf)->x).n[2];
    uVar6 = (((secp256k1_gej *)wnaf)->x).n[3];
    psVar35 = (secp256k1_gej *)auStack_1d8;
    (((secp256k1_gej *)wnaf)->x).n[0] = (((secp256k1_gej *)wnaf)->x).n[0] + auStack_1d8._0_8_;
    (((secp256k1_gej *)wnaf)->x).n[1] = uVar1 + auStack_1d8._8_8_;
    (((secp256k1_gej *)wnaf)->x).n[2] = uVar5 + auStack_1d8._16_8_;
    (((secp256k1_gej *)wnaf)->x).n[3] = uVar6 + auStack_1d8._24_8_;
    puVar27 = (((secp256k1_gej *)wnaf)->x).n + 4;
    *puVar27 = *puVar27 + auStack_1d8._32_8_;
    (((secp256k1_gej *)wnaf)->x).magnitude = iVar7;
    (((secp256k1_gej *)wnaf)->x).normalized = 0;
    psStack_2f0 = (secp256k1_gej *)0x11df03;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    psStack_2f0 = (secp256k1_gej *)0x11df0b;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    psStack_2f0 = (secp256k1_gej *)0x11df13;
    psVar36 = (secp256k1_gej *)wnaf;
    secp256k1_fe_verify((secp256k1_fe *)wnaf);
    iVar7 = (((secp256k1_gej *)wnaf)->x).magnitude + auStack_1d8._40_4_;
    if (0x20 < iVar7) goto LAB_0011e0e1;
    auStack_1d8._0_8_ = (((secp256k1_gej *)wnaf)->x).n[0] + auStack_1d8._0_8_;
    auStack_1d8._8_8_ = (((secp256k1_gej *)wnaf)->x).n[1] + auStack_1d8._8_8_;
    auStack_1d8._16_8_ = (((secp256k1_gej *)wnaf)->x).n[2] + auStack_1d8._16_8_;
    auStack_1d8._24_8_ = (((secp256k1_gej *)wnaf)->x).n[3] + auStack_1d8._24_8_;
    auStack_1d8._32_8_ = auStack_1d8._32_8_ + (((secp256k1_gej *)wnaf)->x).n[4];
    auStack_1d8._44_4_ = 0;
    psStack_2f0 = (secp256k1_gej *)0x11df66;
    auStack_1d8._40_4_ = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1d8);
    psVar35 = (secp256k1_gej *)&((secp256k1_gej *)wnaf)->y;
    psStack_2f0 = (secp256k1_gej *)0x11df7d;
    secp256k1_fe_mul((secp256k1_fe *)psVar35,(secp256k1_fe *)auStack_1d8,
                     (secp256k1_fe *)(auStack_238 + 0x30));
    psVar38 = (secp256k1_gej *)(auStack_298 + 0x30);
    psStack_2f0 = (secp256k1_gej *)0x11df95;
    psVar24 = psVar38;
    secp256k1_fe_mul((secp256k1_fe *)psVar38,(secp256k1_fe *)psVar38,(secp256k1_fe *)auStack_298);
    psStack_2f0 = (secp256k1_gej *)0x11df9d;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    psStack_2f0 = (secp256k1_gej *)0x11dfa5;
    psVar36 = psVar38;
    secp256k1_fe_verify((secp256k1_fe *)psVar38);
    iStack_240 = iStack_240 + (((secp256k1_gej *)wnaf)->y).magnitude;
    if (iStack_240 < 0x21) {
      uVar1 = (((secp256k1_gej *)wnaf)->y).n[1];
      uVar5 = (((secp256k1_gej *)wnaf)->y).n[2];
      uVar6 = (((secp256k1_gej *)wnaf)->y).n[3];
      (((secp256k1_gej *)wnaf)->y).n[0] = (((secp256k1_gej *)wnaf)->y).n[0] + auStack_298._48_8_;
      (((secp256k1_gej *)wnaf)->y).n[1] = uVar1 + uStack_260;
      (((secp256k1_gej *)wnaf)->y).n[2] = uVar5 + uStack_258;
      (((secp256k1_gej *)wnaf)->y).n[3] = uVar6 + uStack_250;
      puVar27 = (((secp256k1_gej *)wnaf)->y).n + 4;
      *puVar27 = *puVar27 + uStack_248;
      (((secp256k1_gej *)wnaf)->y).magnitude = iStack_240;
      (((secp256k1_gej *)wnaf)->y).normalized = 0;
      goto LAB_0011d91f;
    }
  }
  else {
    psStack_2f0 = (secp256k1_gej *)0x11e0cd;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0011e0cd:
    psStack_2f0 = (secp256k1_gej *)0x11e0d2;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0011e0d2:
    psStack_2f0 = (secp256k1_gej *)0x11e0d7;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0011e0d7:
    psStack_2f0 = (secp256k1_gej *)0x11e0dc;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0011e0dc:
    psStack_2f0 = (secp256k1_gej *)0x11e0e1;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_0011e0e1:
    psStack_2f0 = (secp256k1_gej *)0x11e0e6;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  psStack_2f0 = (secp256k1_gej *)secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  psVar39 = (secp256k1_gej *)0xf000000000000;
  psStack_498 = (secp256k1_gej *)0x11e134;
  psStack_458 = psVar36;
  auStack_350._56_8_ = wnaf;
  auStack_350._64_8_ = psVar32;
  auStack_350._72_8_ = psVar34;
  auStack_350._80_8_ = psVar35;
  auStack_350._88_8_ = psVar38;
  psStack_2f0 = (secp256k1_gej *)psVar23;
  secp256k1_fe_verify(&psVar24->x);
  uVar18 = (psVar24->x).n[4];
  lStack_470 = 0x1000003d1;
  uVar25 = (uVar18 >> 0x30) * 0x1000003d1 + (psVar24->x).n[0];
  uVar26 = (uVar25 >> 0x34) + (psVar24->x).n[1];
  uVar16 = (uVar26 >> 0x34) + (psVar24->x).n[2];
  uVar17 = (uVar16 >> 0x34) + (psVar24->x).n[3];
  uVar18 = (uVar17 >> 0x34) + (uVar18 & 0xffffffffffff);
  uStack_460 = (uVar26 | uVar25 | uVar16 | uVar17) & 0xfffffffffffff | uVar18;
  uStack_468 = (uVar25 ^ 0x1000003d0) & uVar26 & uVar16 & uVar17 & (uVar18 ^ 0xf000000000000);
  psStack_498 = (secp256k1_gej *)0x11e1ae;
  secp256k1_fe_verify(&psVar24->x);
  auStack_350._0_8_ = (psVar24->x).n[0];
  auStack_350._8_8_ = (psVar24->x).n[1];
  auStack_350._16_8_ = (psVar24->x).n[2];
  auStack_350._24_8_ = (psVar24->x).n[3];
  auStack_350._32_8_ = (psVar24->x).n[4];
  auStack_350._40_4_ = (psVar24->x).magnitude;
  auStack_350._44_4_ = (psVar24->x).normalized;
  psVar35 = (secp256k1_gej *)auStack_350;
  psStack_498 = (secp256k1_gej *)0x11e1dd;
  psStack_478 = psVar24;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar35);
  auStack_450._0_8_ = (auStack_350._8_8_ << 0x34 | auStack_350._0_8_) & 0x3fffffffffffffff;
  auStack_450._8_8_ =
       (ulong)((uint)auStack_350._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_350._8_8_ >> 10;
  auStack_450._16_8_ =
       (ulong)((uint)auStack_350._24_8_ & 0x3fffffff) << 0x20 | (ulong)auStack_350._16_8_ >> 0x14;
  auStack_450._24_8_ =
       (auStack_350._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_350._24_8_ >> 0x1e;
  auStack_450._32_8_ = (ulong)auStack_350._32_8_ >> 0x28;
  auStack_3a0._16_8_ = 0;
  auStack_3a0._24_8_ = 0;
  auStack_3a0._0_8_ = (undefined1 *)0x0;
  auStack_3a0._8_8_ = 0;
  auStack_3a0._32_8_ = 0;
  uStack_360 = 0;
  uStack_358 = 0;
  uStack_370 = 0;
  uStack_368 = 0;
  auStack_3a0._40_8_ = 1;
  uStack_410 = 0;
  uStack_408 = 0;
  auStack_450._48_8_ = -0x1000003d1;
  uStack_418 = 0;
  auStack_400[0] = 0x100;
  psStack_480 = (secp256k1_gej *)0x0;
  psVar36 = (secp256k1_gej *)0xffffffffffffffff;
  uStack_484 = 5;
  auStack_3f0._0_8_ = auStack_450._0_8_;
  auStack_3f0._8_8_ = auStack_450._8_8_;
  auStack_3f0._16_8_ = auStack_450._16_8_;
  auStack_3f0._24_8_ = auStack_450._24_8_;
  auStack_3f0._32_8_ = auStack_450._32_8_;
LAB_0011e2f3:
  psVar32 = (secp256k1_gej *)auStack_450._48_8_;
  psVar34 = (secp256k1_gej *)0x0;
  psVar29 = (secp256k1_gej *)0x0;
  psVar24 = (secp256k1_gej *)0x1;
  uVar15 = 0x3e;
  ng = (secp256k1_gej *)0x1;
  puVar9 = (undefined1 *)auStack_3f0._0_8_;
  psVar38 = (secp256k1_gej *)auStack_450._48_8_;
  while( true ) {
    r = (secp256k1_gej *)(-1L << ((byte)uVar15 & 0x3f) | (ulong)puVar9);
    psVar14 = (secp256k1_gej *)0x0;
    if (r != (secp256k1_gej *)0x0) {
      for (; ((ulong)r >> (long)psVar14 & 1) == 0;
          psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1)) {
      }
    }
    bVar10 = (byte)psVar14;
    psVar30 = (secp256k1_gej *)((ulong)puVar9 >> (bVar10 & 0x3f));
    ng = (secp256k1_gej *)((long)ng << (bVar10 & 0x3f));
    psVar34 = (secp256k1_gej *)((long)psVar34 << (bVar10 & 0x3f));
    psVar36 = (secp256k1_gej *)((long)psVar36 - (long)psVar14);
    uVar15 = uVar15 - (int)psVar14;
    if (uVar15 == 0) break;
    if (((ulong)psVar38 & 1) == 0) {
      psStack_498 = (secp256k1_gej *)0x11e867;
      secp256k1_fe_inv_var_cold_8();
LAB_0011e867:
      psStack_498 = (secp256k1_gej *)0x11e86c;
      secp256k1_fe_inv_var_cold_7();
LAB_0011e86c:
      psStack_498 = (secp256k1_gej *)0x11e871;
      secp256k1_fe_inv_var_cold_1();
LAB_0011e871:
      psStack_498 = (secp256k1_gej *)0x11e876;
      secp256k1_fe_inv_var_cold_2();
LAB_0011e876:
      psStack_498 = (secp256k1_gej *)0x11e87b;
      secp256k1_fe_inv_var_cold_6();
      psVar30 = psVar38;
      goto LAB_0011e87b;
    }
    if (((ulong)psVar30 & 1) == 0) goto LAB_0011e867;
    r = (secp256k1_gej *)((long)psVar34 * auStack_3f0._0_8_ + (long)ng * auStack_450._48_8_);
    psVar14 = (secp256k1_gej *)(ulong)(0x3e - uVar15);
    bVar10 = (byte)(0x3e - uVar15);
    psVar35 = (secp256k1_gej *)((long)psVar38 << (bVar10 & 0x3f));
    if (r != psVar35) goto LAB_0011e86c;
    psVar35 = (secp256k1_gej *)
              ((long)psVar24 * auStack_3f0._0_8_ + (long)psVar29 * auStack_450._48_8_);
    r = (secp256k1_gej *)((long)psVar30 << (bVar10 & 0x3f));
    if (psVar35 != r) goto LAB_0011e871;
    psVar14 = (secp256k1_gej *)((long)psVar36[-5].x.n + 0xe);
    if (psVar14 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0011e876;
    iVar7 = (int)psVar30;
    if ((long)psVar36 < 0) {
      psVar36 = (secp256k1_gej *)-(long)psVar36;
      uVar37 = (int)psVar36 + 1;
      if ((int)uVar15 <= (int)uVar37) {
        uVar37 = uVar15;
      }
      psVar14 = (secp256k1_gej *)(ulong)uVar37;
      r = (secp256k1_gej *)(ulong)(uVar37 - 0x3f);
      if (0xffffffc1 < uVar37 - 0x3f) {
        psVar40 = (secp256k1_gej *)-(long)psVar34;
        psVar23 = (secp256k1_modinv64_modinfo *)-(long)ng;
        psVar14 = (secp256k1_gej *)-(long)psVar38;
        psVar35 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar37 & 0x3fU)) >> (-(char)uVar37 & 0x3fU));
        uVar37 = (iVar7 * iVar7 + 0x3e) * iVar7 * (int)psVar14 & (uint)psVar35;
        psVar34 = psVar24;
        ng = psVar29;
        psVar39 = psVar40;
        goto LAB_0011e44d;
      }
      goto LAB_0011e885;
    }
    uVar37 = (int)psVar36 + 1;
    if ((int)uVar15 <= (int)uVar37) {
      uVar37 = uVar15;
    }
    psVar14 = (secp256k1_gej *)(ulong)uVar37;
    r = (secp256k1_gej *)(ulong)(uVar37 - 0x3f);
    if (uVar37 - 0x3f < 0xffffffc2) goto LAB_0011e880;
    psVar35 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar37 & 0x3fU)) >> (-(char)uVar37 & 0x3fU))
    ;
    uVar37 = -(iVar7 * (((int)psVar38 * 2 + 2U & 8) + (int)psVar38)) & (uint)psVar35;
    psVar23 = (secp256k1_modinv64_modinfo *)psVar29;
    psVar40 = psVar24;
    psVar14 = psVar30;
    psVar30 = psVar38;
LAB_0011e44d:
    uVar18 = (ulong)uVar37;
    r = (secp256k1_gej *)(uVar18 * (long)psVar30);
    puVar9 = (undefined1 *)((long)(psVar14->x).n + (long)(r->x).n);
    psVar29 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + (long)ng * uVar18);
    psVar14 = (secp256k1_gej *)(uVar18 * (long)psVar34);
    psVar24 = (secp256k1_gej *)((long)(psVar40->x).n + (long)(psVar14->x).n);
    psVar38 = psVar30;
    if (((ulong)puVar9 & (ulong)psVar35) != 0) {
LAB_0011e87b:
      psStack_498 = (secp256k1_gej *)0x11e880;
      secp256k1_fe_inv_var_cold_4();
      psVar38 = psVar30;
LAB_0011e880:
      psStack_498 = (secp256k1_gej *)0x11e885;
      secp256k1_fe_inv_var_cold_3();
LAB_0011e885:
      psStack_498 = (secp256k1_gej *)0x11e88a;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011e88a;
    }
  }
  r = (secp256k1_gej *)((long)psVar34 * (long)psVar29);
  psVar14 = SUB168(SEXT816((long)psVar34) * SEXT816((long)psVar29),8);
  psStack_4b8 = (secp256k1_gej *)auStack_450._48_8_;
  auStack_3f0._48_8_ = ng;
  psStack_3b8 = psVar34;
  psStack_3b0 = psVar29;
  psStack_3a8 = psVar24;
  if ((long)ng * (long)psVar24 - (long)r != 0x4000000000000000 ||
      SUB168(SEXT816((long)ng) * SEXT816((long)psVar24),8) - (long)psVar14 !=
      (ulong)((secp256k1_gej *)((long)ng * (long)psVar24) < r)) goto LAB_0011e8c6;
  psStack_498 = (secp256k1_gej *)0x11e4d3;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_3a0,
             (secp256k1_modinv64_signed62 *)(auStack_3a0 + 0x28),
             (secp256k1_modinv64_trans2x2 *)(auStack_3f0 + 0x30),
             (secp256k1_modinv64_modinfo *)psVar14);
  uVar15 = uStack_484;
  psVar39 = (secp256k1_gej *)(auStack_450 + 0x30);
  psVar35 = (secp256k1_gej *)(ulong)uStack_484;
  ng = (secp256k1_gej *)(ulong)uStack_484;
  psVar23 = &secp256k1_const_modinfo_fe;
  psVar14 = (secp256k1_gej *)0xffffffffffffffff;
  psStack_498 = (secp256k1_gej *)0x11e4f7;
  r = psVar39;
  iVar7 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar39,uStack_484,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar38 = psStack_480;
  psVar32 = (secp256k1_gej *)auStack_3f0;
  if (0 < iVar7) {
    psVar14 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar15;
    psStack_498 = (secp256k1_gej *)0x11e51e;
    r = psVar39;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar7) goto LAB_0011e88f;
    ng = (secp256k1_gej *)(ulong)uVar15;
    psVar14 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_498 = (secp256k1_gej *)0x11e53a;
    r = psVar32;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011e894;
    psVar14 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar15;
    psStack_498 = (secp256k1_gej *)0x11e554;
    r = psVar32;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011e899;
    psStack_498 = (secp256k1_gej *)0x11e571;
    secp256k1_modinv64_update_fg_62_var
              (uVar15,(secp256k1_modinv64_signed62 *)psVar39,(secp256k1_modinv64_signed62 *)psVar32,
               (secp256k1_modinv64_trans2x2 *)(auStack_3f0 + 0x30));
    if ((undefined1 *)auStack_3f0._0_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar15) {
        uVar18 = 1;
        uVar25 = 0;
        do {
          uVar25 = uVar25 | *(ulong *)(auStack_3f0 + uVar18 * 8);
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
        if (uVar25 != 0) goto LAB_0011e5a7;
      }
      r = (secp256k1_gej *)auStack_3f0;
      ng = (secp256k1_gej *)(ulong)uVar15;
      psVar14 = (secp256k1_gej *)0x0;
      psStack_498 = (secp256k1_gej *)0x11e69d;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)r,uVar15,&SECP256K1_SIGNED62_ONE,0);
      if (iVar7 != 0) goto LAB_0011e8b7;
      psStack_498 = (secp256k1_gej *)0x11e6bf;
      iVar7 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)(auStack_450 + 0x30),uVar15,
                         &SECP256K1_SIGNED62_ONE,-1);
      modinfo = extraout_RDX_00;
      if (iVar7 != 0) {
        psStack_498 = (secp256k1_gej *)0x11e6db;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)(auStack_450 + 0x30),uVar15,
                           &SECP256K1_SIGNED62_ONE,1);
        modinfo = extraout_RDX_01;
        if (iVar7 != 0) {
          r = (secp256k1_gej *)auStack_450;
          ng = (secp256k1_gej *)0x5;
          psVar14 = (secp256k1_gej *)0x0;
          psStack_498 = (secp256k1_gej *)0x11e6f7;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar7 != 0) goto LAB_0011e8c1;
          r = (secp256k1_gej *)auStack_3a0;
          ng = (secp256k1_gej *)0x5;
          psVar14 = (secp256k1_gej *)0x0;
          psStack_498 = (secp256k1_gej *)0x11e71a;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar7 != 0) goto LAB_0011e8c1;
          r = (secp256k1_gej *)(auStack_450 + 0x30);
          psVar14 = (secp256k1_gej *)0x1;
          ng = (secp256k1_gej *)(ulong)uVar15;
          psStack_498 = (secp256k1_gej *)0x11e73a;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r,uVar15,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo = extraout_RDX_02;
          if (iVar7 != 0) goto LAB_0011e8c1;
        }
      }
      psStack_498 = (secp256k1_gej *)0x11e75a;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_3a0,
                 *(int64_t *)(auStack_450 + (long)(int)uVar15 * 8 + 0x28),modinfo);
      psVar35 = psStack_458;
      auStack_450._32_8_ = auStack_3a0._32_8_;
      auStack_450._16_8_ = auStack_3a0._16_8_;
      auStack_450._24_8_ = auStack_3a0._24_8_;
      auStack_450._0_8_ = auStack_3a0._0_8_;
      auStack_450._8_8_ = auStack_3a0._8_8_;
      psStack_498 = (secp256k1_gej *)0x11e782;
      secp256k1_fe_from_signed62(&psStack_458->x,(secp256k1_modinv64_signed62 *)auStack_450);
      (psVar35->x).magnitude = (uint)(0 < (psStack_478->x).magnitude);
      (psVar35->x).normalized = 1;
      psStack_498 = (secp256k1_gej *)0x11e7a2;
      secp256k1_fe_verify(&psVar35->x);
      uVar18 = (psVar35->x).n[4];
      psVar24 = (secp256k1_gej *)(uVar18 & 0xffffffffffff);
      uVar25 = (uVar18 >> 0x30) * lStack_470 + (psVar35->x).n[0];
      uVar18 = (uVar25 >> 0x34) + (psVar35->x).n[1];
      uVar16 = (uVar18 >> 0x34) + (psVar35->x).n[2];
      uVar17 = (uVar16 >> 0x34) + (psVar35->x).n[3];
      ng = (secp256k1_gej *)((long)(psVar24->x).n + (uVar17 >> 0x34));
      r = (secp256k1_gej *)
          ((uVar25 ^ 0x1000003d0) & uVar18 & uVar16 & uVar17 & ((ulong)ng ^ 0xf000000000000));
      bVar11 = r == (secp256k1_gej *)0xfffffffffffff ||
               ((uVar18 | uVar25 | uVar16 | uVar17) & 0xfffffffffffff) == 0 &&
               ng == (secp256k1_gej *)0x0;
      psVar14 = (secp256k1_gej *)CONCAT71((int7)(((ulong)ng ^ 0xf000000000000) >> 8),bVar11);
      if ((uStack_468 != 0xfffffffffffff && uStack_460 != 0) != bVar11) {
        secp256k1_fe_verify(&psVar35->x);
        return extraout_EAX_04;
      }
      goto LAB_0011e8bc;
    }
LAB_0011e5a7:
    lVar20 = (long)(int)uVar15;
    uVar18 = *(ulong *)(auStack_450 + lVar20 * 8 + 0x28);
    psVar14 = (secp256k1_gej *)auStack_400[lVar20 + 1];
    r = (secp256k1_gej *)((long)uVar18 >> 0x3f ^ uVar18 | lVar20 + -2 >> 0x3f);
    ng = (secp256k1_gej *)((long)psVar14 >> 0x3f ^ (ulong)psVar14 | (ulong)r);
    if (ng == (secp256k1_gej *)0x0) {
      psVar35 = (secp256k1_gej *)(ulong)(uVar15 - 1);
      *(ulong *)(auStack_450 + lVar20 * 8 + 0x20) =
           *(ulong *)(auStack_450 + lVar20 * 8 + 0x20) | uVar18 << 0x3e;
      psVar14 = (secp256k1_gej *)((long)psVar14 << 0x3e);
      auStack_400[lVar20] = auStack_400[lVar20] | (ulong)psVar14;
    }
    if ((int)psVar38 == 0xb) goto LAB_0011e89e;
    uVar15 = (uint)psVar35;
    psVar23 = &secp256k1_const_modinfo_fe;
    psVar14 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_498 = (secp256k1_gej *)0x11e617;
    ng = psVar35;
    r = psVar39;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011e8a3;
    psVar14 = (secp256k1_gej *)0x1;
    psStack_498 = (secp256k1_gej *)0x11e631;
    ng = psVar35;
    r = psVar39;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar7) goto LAB_0011e8a8;
    psVar14 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_498 = (secp256k1_gej *)0x11e64d;
    ng = psVar35;
    r = psVar32;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar7 < 1) goto LAB_0011e8ad;
    psVar14 = (secp256k1_gej *)0x1;
    psStack_498 = (secp256k1_gej *)0x11e667;
    ng = psVar35;
    r = psVar32;
    iVar7 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar15,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar7) goto LAB_0011e8b2;
    psStack_480 = (secp256k1_gej *)(ulong)((int)psVar38 + 1);
    uStack_484 = uVar15;
    goto LAB_0011e2f3;
  }
LAB_0011e88a:
  psStack_498 = (secp256k1_gej *)0x11e88f;
  secp256k1_fe_inv_var_cold_21();
LAB_0011e88f:
  psStack_498 = (secp256k1_gej *)0x11e894;
  secp256k1_fe_inv_var_cold_20();
LAB_0011e894:
  psStack_498 = (secp256k1_gej *)0x11e899;
  secp256k1_fe_inv_var_cold_19();
LAB_0011e899:
  psStack_498 = (secp256k1_gej *)0x11e89e;
  secp256k1_fe_inv_var_cold_18();
LAB_0011e89e:
  psStack_498 = (secp256k1_gej *)0x11e8a3;
  secp256k1_fe_inv_var_cold_14();
LAB_0011e8a3:
  psStack_498 = (secp256k1_gej *)0x11e8a8;
  secp256k1_fe_inv_var_cold_13();
LAB_0011e8a8:
  psStack_498 = (secp256k1_gej *)0x11e8ad;
  secp256k1_fe_inv_var_cold_12();
LAB_0011e8ad:
  psStack_498 = (secp256k1_gej *)0x11e8b2;
  secp256k1_fe_inv_var_cold_11();
LAB_0011e8b2:
  psStack_498 = (secp256k1_gej *)0x11e8b7;
  secp256k1_fe_inv_var_cold_10();
LAB_0011e8b7:
  psStack_498 = (secp256k1_gej *)0x11e8bc;
  secp256k1_fe_inv_var_cold_15();
LAB_0011e8bc:
  psStack_498 = (secp256k1_gej *)0x11e8c1;
  secp256k1_fe_inv_var_cold_17();
LAB_0011e8c1:
  psStack_498 = (secp256k1_gej *)0x11e8c6;
  secp256k1_fe_inv_var_cold_16();
  psStack_4b8 = psVar32;
LAB_0011e8c6:
  psStack_498 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar7 = (int)r;
  psVar32 = (secp256k1_gej *)psVar23;
  psVar34 = psStack_4b8;
  psStack_4c0 = psVar35;
  psStack_4b0 = psVar38;
  psStack_4a8 = psVar36;
  psStack_4a0 = psVar39;
  psStack_498 = (secp256k1_gej *)psVar23;
  if (iVar7 < 1) {
LAB_0011eb73:
    psStack_4f0 = (secp256k1_gej *)0x11eb78;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011eb78:
    psStack_4f0 = (secp256k1_gej *)0x11eb7d;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar30 = psVar36;
LAB_0011eb7d:
    psStack_4f0 = (secp256k1_gej *)0x11eb82;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011eb82:
    psStack_4f0 = (secp256k1_gej *)0x11eb87;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011eb87:
    psStack_4f0 = (secp256k1_gej *)0x11eb8c;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar36 = psVar30;
    psVar29 = psVar39;
  }
  else {
    uStack_4c8 = (psVar14->x).n[0];
    uStack_4d0 = (psVar14->x).n[1];
    uVar1 = (ng->x).n[0];
    psVar24 = (secp256k1_gej *)(extraout_RDX_03->x).n[0];
    psVar36 = (secp256k1_gej *)(uVar1 * uStack_4c8);
    lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_4c8),8);
    uVar25 = (long)psVar24 * uStack_4d0;
    psVar35 = SUB168(SEXT816((long)psVar24) * SEXT816((long)uStack_4d0),8);
    psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar18 = (ulong)((secp256k1_gej *)~uVar25 < psVar36);
    lVar20 = (0x7fffffffffffffff - (long)psVar35) - lVar19;
    psVar34 = extraout_RDX_03;
    psVar29 = (secp256k1_gej *)~uVar25;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar35,lVar19) != SBORROW8(lVar20,uVar18)) ==
        (long)(lVar20 - uVar18) < 0 || (long)psVar35 < 0) {
      uStack_4d8 = (psVar14->x).n[2];
      psVar29 = (secp256k1_gej *)(psVar14->x).n[3];
      puVar27 = (uint64_t *)((long)(psVar36->x).n + uVar25);
      psVar35 = (secp256k1_gej *)
                ((long)(psVar35->x).n + (ulong)CARRY8(uVar25,(ulong)psVar36) + lVar19);
      uVar25 = uVar1 * uStack_4d8;
      psVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_4d8),8);
      auVar3 = SEXT816((long)psVar24);
      psVar24 = (secp256k1_gej *)((long)psVar24 * (long)psVar29);
      lVar19 = SUB168(auVar3 * SEXT816((long)psVar29),8);
      uVar18 = (ulong)(-(long)psVar24 - 1U < uVar25);
      lVar20 = (0x7fffffffffffffff - lVar19) - (long)psVar36;
      bVar11 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar36) != SBORROW8(lVar20,uVar18)) !=
               (long)(lVar20 - uVar18) < 0 && -1 < lVar19;
      psVar14 = (secp256k1_gej *)CONCAT71((int7)(-(long)psVar24 - 1U >> 8),bVar11);
      psStack_4e0 = psVar29;
      if (bVar11) goto LAB_0011eb91;
      bVar11 = CARRY8((ulong)psVar24,uVar25);
      psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + uVar25);
      lVar20 = (long)(psVar36->x).n + (ulong)bVar11 + lVar19;
      psVar39 = psVar29;
      if (((ulong)puVar27 & 0x3fffffffffffffff) != 0) goto LAB_0011eb78;
      psVar30 = psVar36;
      if (((ulong)psVar24 & 0x3fffffffffffffff) != 0) goto LAB_0011eb7d;
      psVar24 = (secp256k1_gej *)((ulong)psVar24 >> 0x3e | lVar20 * 4);
      uVar18 = (ulong)puVar27 >> 0x3e | (long)psVar35 * 4;
      psVar30 = (secp256k1_gej *)(lVar20 >> 0x3e);
      psVar35 = (secp256k1_gej *)((long)psVar35 >> 0x3e);
      iStack_4e4 = iVar7;
      if (iVar7 != 1) {
        psVar32 = (secp256k1_gej *)0x3fffffffffffffff;
        r = (secp256k1_gej *)((ulong)r & 0xffffffff);
        psVar14 = (secp256k1_gej *)0x1;
        do {
          psVar36 = (secp256k1_gej *)(ng->x).n[(long)psVar14];
          psVar39 = (secp256k1_gej *)((long)psVar36 * uStack_4c8 + uVar18);
          puVar9 = (undefined1 *)
                   ((long)(psVar35->x).n +
                   (ulong)CARRY8((long)psVar36 * uStack_4c8,uVar18) +
                   SUB168(SEXT816((long)psVar36) * SEXT816((long)uStack_4c8),8));
          uVar1 = (extraout_RDX_03->x).n[(long)psVar14];
          uVar18 = uVar1 * uStack_4d0;
          lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_4d0),8);
          if (-1 < lVar20) {
            psVar35 = (secp256k1_gej *)(-1 - uVar18);
            lVar19 = (0x7fffffffffffffff - lVar20) - (long)puVar9;
            psVar38 = (secp256k1_gej *)(lVar19 - (ulong)(psVar35 < psVar39));
            if ((SBORROW8(0x7fffffffffffffff - lVar20,(long)puVar9) !=
                SBORROW8(lVar19,(ulong)(psVar35 < psVar39))) == (long)psVar38 < 0)
            goto LAB_0011ea62;
LAB_0011eb69:
            psStack_4f0 = (secp256k1_gej *)0x11eb6e;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011eb6e:
            psStack_4f0 = (secp256k1_gej *)0x11eb73;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011eb73;
          }
          psVar38 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar18 != 0));
          psVar35 = (secp256k1_gej *)
                    (((long)puVar9 - (long)psVar38) - (ulong)(psVar39 < (secp256k1_gej *)-uVar18));
          if ((SBORROW8((long)puVar9,(long)psVar38) !=
              SBORROW8((long)puVar9 - (long)psVar38,(ulong)(psVar39 < (secp256k1_gej *)-uVar18))) !=
              (long)psVar35 < 0) goto LAB_0011eb69;
LAB_0011ea62:
          bVar11 = CARRY8((ulong)psVar39,uVar18);
          psVar39 = (secp256k1_gej *)((long)(psVar39->x).n + uVar18);
          psVar35 = (secp256k1_gej *)((long)(psVar24->x).n + (long)psVar36 * uStack_4d8);
          psVar36 = (secp256k1_gej *)
                    ((long)(psVar30->x).n +
                    (ulong)CARRY8((long)psVar36 * uStack_4d8,(ulong)psVar24) +
                    SUB168(SEXT816((long)psVar36) * SEXT816((long)uStack_4d8),8));
          uVar18 = uVar1 * (long)psVar29;
          lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar29),8);
          if (lVar19 < 0) {
            lVar28 = (-0x8000000000000000 - lVar19) - (ulong)(uVar18 != 0);
            lVar2 = (long)psVar36 - lVar28;
            psVar24 = (secp256k1_gej *)(lVar2 - (ulong)(psVar35 < (secp256k1_gej *)-uVar18));
            psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
            if ((SBORROW8((long)psVar36,lVar28) !=
                SBORROW8(lVar2,(ulong)(psVar35 < (secp256k1_gej *)-uVar18))) != (long)psVar24 < 0)
            goto LAB_0011eb6e;
          }
          else {
            psVar24 = (secp256k1_gej *)(-1 - uVar18);
            psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
            lVar2 = (0x7fffffffffffffff - lVar19) - (long)psVar36;
            if ((SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar36) !=
                SBORROW8(lVar2,(ulong)(psVar24 < psVar35))) !=
                (long)(lVar2 - (ulong)(psVar24 < psVar35)) < 0) goto LAB_0011eb6e;
          }
          puVar27 = (uint64_t *)((long)(psVar35->x).n + uVar18);
          lVar19 = (long)(psVar36->x).n + (ulong)CARRY8((ulong)psVar35,uVar18) + lVar19;
          uVar18 = (long)(puVar9 + (ulong)bVar11 + lVar20) * 4 | (ulong)psVar39 >> 0x3e;
          (ng->x).n[(long)&psVar14[-1].field_0x97] = (uint64_t)((ulong)psVar39 & 0x3fffffffffffffff)
          ;
          psVar24 = (secp256k1_gej *)(lVar19 * 4 | (ulong)puVar27 >> 0x3e);
          (extraout_RDX_03->x).n[(long)&psVar14[-1].field_0x97] =
               (ulong)puVar27 & 0x3fffffffffffffff;
          psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
          psVar30 = (secp256k1_gej *)(lVar19 >> 0x3e);
          psVar35 = (secp256k1_gej *)((long)(puVar9 + (ulong)bVar11 + lVar20) >> 0x3e);
          psVar39 = (secp256k1_gej *)((ulong)psVar39 & 0x3fffffffffffffff);
        } while (r != psVar14);
      }
      psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
      if ((undefined1 *)((long)(psVar35->x).n + ((ulong)(0x7fffffffffffffff < uVar18) - 1)) !=
          (undefined1 *)0xffffffffffffffff) goto LAB_0011eb82;
      psVar14 = (secp256k1_gej *)0xffffffffffffffff;
      (ng->x).n[(long)iVar7 + -1] = uVar18;
      psVar30 = (secp256k1_gej *)
                ((long)(psVar30->x).n + ((ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar24) - 1)
                );
      if (psVar30 == (secp256k1_gej *)0xffffffffffffffff) {
        (extraout_RDX_03->x).n[(long)iVar7 + -1] = (uint64_t)psVar24;
        return iVar7 + -1;
      }
      goto LAB_0011eb87;
    }
  }
  psStack_4f0 = (secp256k1_gej *)0x11eb91;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011eb91:
  psStack_4f0 = (secp256k1_gej *)secp256k1_ecmult_multi_simple_var;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psStack_518 = psVar35;
  psStack_510 = psVar34;
  psStack_508 = psVar38;
  psStack_500 = psVar36;
  psStack_4f8 = psVar29;
  psStack_4f0 = psVar32;
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&sStack_c98);
  sStack_d30.x.n[0] = (uint64_t)asStack_c00;
  sStack_d30.x.n[1] = (uint64_t)asStack_ad0;
  sStack_d30.x.n[2] = (uint64_t)&sStack_930;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_d30,r,1,&sStack_c98,&secp256k1_scalar_zero,
             (secp256k1_scalar *)ng);
  if (psVar24 != (secp256k1_gej *)0x0) {
    psVar35 = (secp256k1_gej *)0x0;
    do {
      iVar7 = (*extraout_RDX_04)(&sStack_d4c,&sStack_b38,psVar35,psVar14);
      if (iVar7 == 0) {
        return 0;
      }
      secp256k1_gej_set_ge(&sStack_d30,&sStack_b38);
      sStack_d48.aux = asStack_c00;
      sStack_d48.pre_a = asStack_ad0;
      sStack_d48.ps = &sStack_930;
      psVar36 = &sStack_d30;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_d48,&sStack_c98,1,&sStack_d30,&sStack_d4c,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r,r,&sStack_c98,&psVar36->x);
      psVar35 = (secp256k1_gej *)((long)(psVar35->x).n + 1);
    } while (psVar24 != psVar35);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}